

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O2

bool __thiscall fast_float::bigint::pow5(bigint *this,uint32_t exp)

{
  bool bVar1;
  uint64_t *puVar2;
  limb *plVar3;
  limb_span y;
  
  puVar2 = pow5::small_power_of_5;
  plVar3 = pow5::small_power_of_5 + exp;
  for (; 0x86 < exp; exp = exp - 0x87) {
    y.length = (size_t)puVar2;
    y.ptr = (unsigned_long *)0x5;
    bVar1 = large_mul<(unsigned_short)62>
                      ((fast_float *)this,(stackvec<(unsigned_short)62> *)pow5::large_power_of_5,y);
    if (!bVar1) goto LAB_0013154c;
    plVar3 = plVar3 + -0x87;
  }
  for (; 0x1a < exp; exp = exp - 0x1b) {
    bVar1 = small_mul<(unsigned_short)62>(&this->vec,0x6765c793fa10079d);
    if (!bVar1) goto LAB_0013154c;
    plVar3 = plVar3 + -0x1b;
  }
  if ((exp == 0) || (bVar1 = small_mul<(unsigned_short)62>(&this->vec,*plVar3), bVar1)) {
    bVar1 = true;
  }
  else {
LAB_0013154c:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool pow5(uint32_t exp) noexcept {
    // multiply by a power of 5
    static constexpr uint32_t large_step = 135;
    static constexpr uint64_t small_power_of_5[] = {
      1UL, 5UL, 25UL, 125UL, 625UL, 3125UL, 15625UL, 78125UL, 390625UL,
      1953125UL, 9765625UL, 48828125UL, 244140625UL, 1220703125UL,
      6103515625UL, 30517578125UL, 152587890625UL, 762939453125UL,
      3814697265625UL, 19073486328125UL, 95367431640625UL, 476837158203125UL,
      2384185791015625UL, 11920928955078125UL, 59604644775390625UL,
      298023223876953125UL, 1490116119384765625UL, 7450580596923828125UL,
    };
#ifdef FASTFLOAT_64BIT_LIMB
    constexpr static limb large_power_of_5[] = {
      1414648277510068013UL, 9180637584431281687UL, 4539964771860779200UL,
      10482974169319127550UL, 198276706040285095UL};
#else
    constexpr static limb large_power_of_5[] = {
      4279965485U, 329373468U, 4020270615U, 2137533757U, 4287402176U,
      1057042919U, 1071430142U, 2440757623U, 381945767U, 46164893U};
#endif
    size_t large_length = sizeof(large_power_of_5) / sizeof(limb);
    limb_span large = limb_span(large_power_of_5, large_length);
    while (exp >= large_step) {
      FASTFLOAT_TRY(large_mul(vec, large));
      exp -= large_step;
    }
#ifdef FASTFLOAT_64BIT_LIMB
    uint32_t small_step = 27;
    limb max_native = 7450580596923828125UL;
#else
    uint32_t small_step = 13;
    limb max_native = 1220703125U;
#endif
    while (exp >= small_step) {
      FASTFLOAT_TRY(small_mul(vec, max_native));
      exp -= small_step;
    }
    if (exp != 0) {
      FASTFLOAT_TRY(small_mul(vec, limb(small_power_of_5[exp])));
    }

    return true;
  }